

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key_tests.cpp
# Opt level: O0

void __thiscall key_tests::key_ellswift::test_method(key_ellswift *this)

{
  Span<unsigned_char> s;
  Span<const_std::byte> ent32_00;
  bool bVar1;
  const_iterator pbVar2;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *secret;
  const_iterator __end1;
  const_iterator __begin1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__range1;
  CKey key;
  CPubKey decoded_pubkey;
  EllSwiftPubKey ellswift;
  uint256 ent32;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc78;
  undefined7 in_stack_fffffffffffffc80;
  undefined1 in_stack_fffffffffffffc87;
  assertion_result *in_stack_fffffffffffffc88;
  CPubKey *in_stack_fffffffffffffc90;
  CPubKey *in_stack_fffffffffffffc98;
  CKey *in_stack_fffffffffffffca0;
  undefined7 in_stack_fffffffffffffca8;
  undefined1 in_stack_fffffffffffffcaf;
  lazy_ostream *in_stack_fffffffffffffcb0;
  undefined7 in_stack_fffffffffffffcb8;
  undefined1 in_stack_fffffffffffffcbf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcc0;
  undefined7 in_stack_fffffffffffffcc8;
  undefined1 in_stack_fffffffffffffccf;
  long *local_2f0;
  string *local_2c0;
  const_string local_290;
  assertion_result local_250 [3];
  const_string local_208;
  lazy_ostream local_1e8 [2];
  assertion_result local_1c8 [3];
  long *local_180;
  undefined8 local_178;
  long local_88 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string
            (in_stack_fffffffffffffcc0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffcbf,in_stack_fffffffffffffcb8));
  std::__cxx11::string::string
            (in_stack_fffffffffffffcc0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffcbf,in_stack_fffffffffffffcb8));
  std::__cxx11::string::string
            (in_stack_fffffffffffffcc0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffcbf,in_stack_fffffffffffffcb8));
  std::__cxx11::string::string
            (in_stack_fffffffffffffcc0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffcbf,in_stack_fffffffffffffcb8));
  local_180 = local_88;
  local_178 = 4;
  local_2c0 = std::
              initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::begin((initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)in_stack_fffffffffffffc78);
  pbVar2 = std::
           initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::end((initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffffc88);
  for (; local_2c0 != pbVar2; local_2c0 = local_2c0 + 1) {
    DecodeSecret(local_2c0);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffc88,
                 (pointer)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
                 (unsigned_long)in_stack_fffffffffffffc78);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffc78);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffcbf,in_stack_fffffffffffffcb8),
                 (const_string *)in_stack_fffffffffffffcb0,
                 CONCAT17(in_stack_fffffffffffffcaf,in_stack_fffffffffffffca8),
                 (const_string *)in_stack_fffffffffffffca0);
      CKey::IsValid((CKey *)in_stack_fffffffffffffc78);
      boost::test_tools::assertion_result::assertion_result
                (in_stack_fffffffffffffc88,(bool)in_stack_fffffffffffffc87);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffc88,
                 (pointer)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
                 (unsigned_long)in_stack_fffffffffffffc78);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
                 (basic_cstring<const_char> *)in_stack_fffffffffffffc78);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffc88,
                 (pointer)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
                 (unsigned_long)in_stack_fffffffffffffc78);
      in_stack_fffffffffffffc78 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_1c8,local_1e8,&local_208,0x155,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_fffffffffffffc78);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffffc78);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    RandomMixin<FastRandomContext>::rand256
              ((RandomMixin<FastRandomContext> *)
               CONCAT17(in_stack_fffffffffffffcaf,in_stack_fffffffffffffca8));
    Span<unsigned_char>::Span<uint256>
              ((Span<unsigned_char> *)in_stack_fffffffffffffc88,
               (uint256 *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
               in_stack_fffffffffffffc78);
    s.m_size = (size_t)in_stack_fffffffffffffc98;
    s.m_data = in_stack_fffffffffffffc90->vch;
    AsBytes<unsigned_char>(s);
    ent32_00.m_size._0_7_ = in_stack_fffffffffffffcc8;
    ent32_00.m_data = (byte *)in_stack_fffffffffffffcc0;
    ent32_00.m_size._7_1_ = in_stack_fffffffffffffccf;
    CKey::EllSwiftCreate
              ((CKey *)CONCAT17(in_stack_fffffffffffffcaf,in_stack_fffffffffffffca8),ent32_00);
    EllSwiftPubKey::Decode
              ((EllSwiftPubKey *)CONCAT17(in_stack_fffffffffffffcaf,in_stack_fffffffffffffca8));
    in_stack_fffffffffffffccf = CKey::IsCompressed((CKey *)in_stack_fffffffffffffc78);
    if (!(bool)in_stack_fffffffffffffccf) {
      CPubKey::Decompress((CPubKey *)in_stack_fffffffffffffc88);
    }
    do {
      in_stack_fffffffffffffcc0 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffc88,
                 (pointer)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
                 (unsigned_long)in_stack_fffffffffffffc78);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffc78);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffcbf,in_stack_fffffffffffffcb8),
                 (const_string *)in_stack_fffffffffffffcb0,
                 CONCAT17(in_stack_fffffffffffffcaf,in_stack_fffffffffffffca8),
                 (const_string *)in_stack_fffffffffffffca0);
      CKey::GetPubKey(in_stack_fffffffffffffca0);
      in_stack_fffffffffffffcbf = ::operator==(in_stack_fffffffffffffc98,in_stack_fffffffffffffc90);
      boost::test_tools::assertion_result::assertion_result
                (in_stack_fffffffffffffc88,(bool)in_stack_fffffffffffffc87);
      in_stack_fffffffffffffcb0 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffc88,
                 (pointer)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
                 (unsigned_long)in_stack_fffffffffffffc78);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
                 (basic_cstring<const_char> *)in_stack_fffffffffffffc78);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffc88,
                 (pointer)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
                 (unsigned_long)in_stack_fffffffffffffc78);
      in_stack_fffffffffffffc78 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_250,(lazy_ostream *)&stack0xfffffffffffffd90,&local_290,0x161,CHECK,
                 CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_fffffffffffffc78);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffffc78);
      in_stack_fffffffffffffcaf = boost::test_tools::tt_detail::dummy_cond();
    } while ((bool)in_stack_fffffffffffffcaf);
    CKey::~CKey((CKey *)in_stack_fffffffffffffc78);
  }
  local_2f0 = &local_8;
  do {
    local_2f0 = local_2f0 + -4;
    std::__cxx11::string::~string(in_stack_fffffffffffffc78);
  } while (local_2f0 != local_88);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(key_ellswift)
{
    for (const auto& secret : {strSecret1, strSecret2, strSecret1C, strSecret2C}) {
        CKey key = DecodeSecret(secret);
        BOOST_CHECK(key.IsValid());

        uint256 ent32 = m_rng.rand256();
        auto ellswift = key.EllSwiftCreate(AsBytes(Span{ent32}));

        CPubKey decoded_pubkey = ellswift.Decode();
        if (!key.IsCompressed()) {
            // The decoding constructor returns a compressed pubkey. If the
            // original was uncompressed, we must decompress the decoded one
            // to compare.
            decoded_pubkey.Decompress();
        }
        BOOST_CHECK(key.GetPubKey() == decoded_pubkey);
    }
}